

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O1

pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect> *
ellipses::detect_circle_approach
          (pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>
           *__return_storage_ptr__,Mat *pretreat,Mat *original,bool agregate_contour,bool debug)

{
  pointer pPVar1;
  undefined8 uVar2;
  void *pvVar3;
  Size SVar4;
  int iVar5;
  Point_<int> *p;
  long lVar6;
  _InputArray *p_Var7;
  pointer pPVar8;
  int iVar9;
  ulong uVar10;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *r;
  undefined7 in_register_00000081;
  const_iterator __end1;
  int iVar11;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *v;
  int iVar12;
  const_iterator __begin1;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> result;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  float local_ec;
  _InputArray local_e8;
  double local_c8;
  float local_c0;
  float local_bc;
  undefined1 local_b8 [40];
  Mat *local_90;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_88;
  undefined1 local_64 [8];
  undefined4 local_5c;
  float local_58;
  float local_54;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_50;
  undefined8 local_38;
  
  if ((int)CONCAT71(in_register_00000081,debug) != 0) {
    p_Var7 = (_InputArray *)(local_b8 + 0x10);
    local_b8._0_8_ = p_Var7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"gray","");
    cv::namedWindow((string *)local_b8,0);
    if ((_InputArray *)local_b8._0_8_ != p_Var7) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
    local_b8._0_8_ = p_Var7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"gray","");
    local_e8.sz.width = 0;
    local_e8.sz.height = 0;
    local_e8.flags = 0x1010000;
    local_e8.obj = pretreat;
    cv::imshow((string *)local_b8,&local_e8);
    if ((_InputArray *)local_b8._0_8_ != p_Var7) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
    cv::waitKey(0);
  }
  local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b8;
  local_b8._0_8_ = (_InputArray *)0x0;
  local_b8._8_8_ = (_InputArray *)0x0;
  local_b8._16_8_ = (pointer)0x0;
  local_e8.sz.width = 0;
  local_e8.sz.height = 0;
  local_e8.flags = 0x1010000;
  local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_88.
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x8204000c);
  local_38 = 0;
  local_e8.obj = pretreat;
  cv::findContours(&local_e8,&local_88,1,2);
  uVar2 = local_b8._8_8_;
  local_e8._0_8_ = (_InputArray *)0x0;
  local_e8.obj = (_InputArray *)0x0;
  local_e8.sz.width = 0;
  local_e8.sz.height = 0;
  if (local_b8._0_8_ != local_b8._8_8_) {
    p_Var7 = (_InputArray *)local_b8._0_8_;
    do {
      if ((ulong)((long)local_e8.obj - local_e8._0_8_) <
          (ulong)((long)*(pointer *)
                         &((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                          &p_Var7->obj)->_M_impl -
                 (long)(((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                        &p_Var7->flags)->_M_impl).super__Vector_impl_data._M_start)) {
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator=
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_e8,
                   (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)p_Var7);
      }
      p_Var7 = p_Var7 + 1;
    } while (p_Var7 != (_InputArray *)uVar2);
  }
  pvVar3 = local_e8.obj;
  if (agregate_contour) {
    if ((void *)local_e8._0_8_ == local_e8.obj) {
      iVar12 = 0;
      iVar11 = 0;
    }
    else {
      lVar6 = (long)local_e8.obj - local_e8._0_8_ >> 3;
      auVar16._8_4_ = (int)((long)local_e8.obj - local_e8._0_8_ >> 0x23);
      auVar16._0_8_ = lVar6;
      auVar16._12_4_ = 0x45300000;
      dVar13 = (auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
      dVar15 = 0.0;
      dVar18 = 0.0;
      p_Var7 = (_InputArray *)local_e8._0_8_;
      do {
        dVar15 = dVar15 + (double)p_Var7->flags / dVar13;
        dVar18 = dVar18 + (double)*(int *)&p_Var7->field_0x4 / dVar13;
        p_Var7 = (_InputArray *)&p_Var7->obj;
      } while (p_Var7 != (_InputArray *)local_e8.obj);
      iVar11 = (int)dVar15;
      iVar12 = (int)dVar18;
    }
    local_90 = original;
    if ((void *)local_e8._0_8_ == local_e8.obj) {
      dVar13 = 0.0;
    }
    else {
      dVar13 = 0.0;
      p_Var7 = (_InputArray *)local_e8._0_8_;
      do {
        iVar5 = iVar11 - p_Var7->flags;
        iVar9 = iVar12 - *(int *)&p_Var7->field_0x4;
        dVar15 = (double)(iVar9 * iVar9 + iVar5 * iVar5);
        if (dVar15 < 0.0) {
          local_c8 = dVar13;
          dVar15 = sqrt(dVar15);
          dVar13 = local_c8;
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        dVar13 = dVar13 + dVar15;
        p_Var7 = (_InputArray *)&p_Var7->obj;
      } while (p_Var7 != (_InputArray *)pvVar3);
    }
    uVar2 = local_b8._8_8_;
    if (local_b8._0_8_ != local_b8._8_8_) {
      lVar6 = (long)local_e8.obj - local_e8._0_8_ >> 3;
      auVar14._8_4_ = (int)((long)local_e8.obj - local_e8._0_8_ >> 0x23);
      auVar14._0_8_ = lVar6;
      auVar14._12_4_ = 0x45300000;
      dVar13 = (dVar13 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) * 2.5;
      p_Var7 = (_InputArray *)local_b8._0_8_;
      local_c8 = dVar13;
      do {
        pPVar8 = (((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                  &p_Var7->flags)->_M_impl).super__Vector_impl_data._M_start;
        pPVar1 = *(pointer *)
                  &((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&p_Var7->obj
                   )->_M_impl;
        uVar10 = (long)pPVar1 - (long)pPVar8 >> 3;
        if (6 < uVar10) {
          if (pPVar8 == pPVar1) {
            iVar5 = 0;
            iVar9 = 0;
          }
          else {
            auVar17._8_4_ = (int)((long)pPVar1 - (long)pPVar8 >> 0x23);
            auVar17._0_8_ = uVar10;
            auVar17._12_4_ = 0x45300000;
            dVar15 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
            dVar18 = 0.0;
            dVar19 = 0.0;
            do {
              dVar18 = dVar18 + (double)pPVar8->x / dVar15;
              dVar19 = dVar19 + (double)pPVar8->y / dVar15;
              pPVar8 = pPVar8 + 1;
            } while (pPVar8 != pPVar1);
            iVar9 = (int)dVar18;
            iVar5 = (int)dVar19;
          }
          iVar9 = iVar11 - iVar9;
          if ((iVar9 != 0) || (iVar12 != iVar5)) {
            dVar15 = (double)((iVar12 - iVar5) * (iVar12 - iVar5) + iVar9 * iVar9);
            if (dVar15 < 0.0) {
              dVar15 = sqrt(dVar15);
              dVar13 = local_c8;
            }
            else {
              dVar15 = SQRT(dVar15);
            }
            if (dVar15 < dVar13) {
              std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<cv::Point_<int>*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                        ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_e8,
                         local_e8.obj,
                         (((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                          &p_Var7->flags)->_M_impl).super__Vector_impl_data._M_start,
                         *(pointer *)
                          &((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                           &p_Var7->obj)->_M_impl);
              dVar13 = local_c8;
            }
          }
        }
        p_Var7 = p_Var7 + 1;
      } while (p_Var7 != (_InputArray *)uVar2);
    }
    local_50.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_e8._0_8_;
    local_50.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_e8.obj;
    local_50.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_e8.sz;
    local_e8._0_8_ = (_InputArray *)0x0;
    local_e8.obj = (pointer)0x0;
    local_e8.sz.width = 0;
    local_e8.sz.height = 0;
    cleanup_center_points(&local_88,&local_50,local_90,debug);
    SVar4 = local_e8.sz;
    uVar2 = local_e8._0_8_;
    local_e8._0_8_ =
         local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_e8.obj = local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
    local_e8.sz = (Size)local_88.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((_InputArray *)uVar2 != (_InputArray *)0x0) {
      operator_delete((void *)uVar2,(long)SVar4 - uVar2);
    }
    if ((_InputArray *)
        local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (_InputArray *)0x0) {
      operator_delete(local_88.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((_InputArray *)
        local_50.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (_InputArray *)0x0) {
      operator_delete(local_50.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_c8 = (double)((ulong)local_c8 & 0xffffffff00000000);
  local_ec = 0.0;
  local_90 = (Mat *)((ulong)local_90 & 0xffffffff00000000);
  local_bc = 0.0;
  local_c0 = 0.0;
  if (0x28 < (ulong)((long)local_e8.obj - local_e8._0_8_)) {
    local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_88.
                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x8103000c);
    local_88.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_e8;
    cv::fitEllipse((_InputArray *)local_64);
    local_c8 = (double)CONCAT44(local_c8._4_4_,local_64._0_4_);
    local_ec = (float)local_64._4_4_;
    local_90 = (Mat *)CONCAT44(local_90._4_4_,local_5c);
    local_bc = local_58;
    local_c0 = local_54;
  }
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            (&__return_storage_ptr__->first,
             (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_e8);
  (__return_storage_ptr__->second).center.x = local_c8._0_4_;
  (__return_storage_ptr__->second).center.y = local_ec;
  (__return_storage_ptr__->second).size.width = local_90._0_4_;
  (__return_storage_ptr__->second).size.height = local_bc;
  (__return_storage_ptr__->second).angle = local_c0;
  if ((_InputArray *)local_e8._0_8_ != (_InputArray *)0x0) {
    operator_delete((void *)local_e8._0_8_,(long)local_e8.sz - local_e8._0_8_);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<cv::Point>, cv::RotatedRect> detect_circle_approach(
    const cv::Mat& pretreat, const cv::Mat& original, bool agregate_contour, bool debug)
{
    if(debug)
    {
        cv::namedWindow("gray", cv::WINDOW_NORMAL);
        cv::imshow("gray", pretreat);
        cv::waitKey(0);
    }

    std::vector<std::vector<cv::Point>> contours;
    findContours(pretreat, contours, cv::RETR_LIST, cv::CHAIN_APPROX_SIMPLE);

    std::vector<cv::Point> result;

    for(auto& v : contours)
    {
        if(v.size() > result.size())
        {
            result = v;
        }
    }

    if(agregate_contour)
    {
        auto top_center = center_of_mass(result);
        auto meand = mean_distance(top_center, result) * 2.5;

        for(auto& r : contours)
        {
            if(r.size() > 6)
            {
                auto local_center = center_of_mass(r);

                if(top_center != local_center && euclideanDistance(top_center, local_center) < meand)
                {
                    result.insert(result.end(), r.begin(), r.end());
                }
            }
        }

        result = cleanup_center_points(std::move(result), original, debug);
    }

    cv::RotatedRect rect;
    if(result.size() > 5)
        rect = cv::fitEllipse(result);

    return {result, rect};
}